

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_decompose.hpp
# Opt level: O1

string * __thiscall
lest::to_string<std::__cxx11::string,std::__cxx11::string>
          (string *__return_storage_ptr__,lest *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *lhs,string *op,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rhs)

{
  long lVar1;
  long *plVar2;
  ostream *poVar3;
  long *plVar4;
  ostringstream os;
  long *local_208;
  long local_1f8;
  long lStack_1f0;
  long *local_1e8;
  long local_1e0;
  long local_1d8;
  long lStack_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::operator+(&local_1c8,"\"",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_1c8);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_1d8 = *plVar4;
    lStack_1d0 = plVar2[3];
    local_1e8 = &local_1d8;
  }
  else {
    local_1d8 = *plVar4;
    local_1e8 = (long *)*plVar2;
  }
  local_1e0 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p);
  }
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(char *)local_1e8,local_1e0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(lhs->_M_dataplus)._M_p,lhs->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  std::operator+(&local_1c8,"\"",op);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_1c8);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_1f8 = *plVar4;
    lStack_1f0 = plVar2[3];
    local_208 = &local_1f8;
  }
  else {
    local_1f8 = *plVar4;
    local_208 = (long *)*plVar2;
  }
  lVar1 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_208,lVar1);
  if (local_208 != &local_1f8) {
    operator_delete(local_208);
  }
  if (local_1e8 != &local_1d8) {
    operator_delete(local_1e8);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

inline std::string to_string( L const & lhs, std::string op, R const & rhs )
{
    std::ostringstream os; os << to_string( lhs ) << " " << op << " " << to_string( rhs ); return os.str();
}